

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int make_canonical(ly_ctx *ctx,int type,char **value,void *data1,void *data2)

{
  byte bVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  char *__string;
  uint8_t *puVar5;
  char *__src;
  char *pcVar6;
  uint uVar7;
  undefined8 uVar8;
  char *pcVar9;
  char cVar10;
  long lVar11;
  uint uVar12;
  
  __string = ly_buf();
  puVar5 = ly_buf_used_location();
  if ((*puVar5 == '\0') || (*__string == '\0')) {
    __src = (char *)0x0;
  }
  else {
    __src = strndup(__string,0x3ff);
  }
  puVar5 = ly_buf_used_location();
  *puVar5 = *puVar5 + '\x01';
  switch(type) {
  case 2:
    iVar4 = *data2;
    *__string = '\0';
    if (0 < (long)iVar4) {
      lVar11 = 0;
      do {
        puVar2 = *(undefined8 **)((long)data1 + lVar11 * 8);
        if (puVar2 != (undefined8 *)0x0) {
          if (*__string == '\0') {
            strcpy(__string,(char *)*puVar2);
          }
          else {
            pcVar9 = strdup(__string);
            sprintf(__string,"%s %s",pcVar9,*puVar2);
            free(pcVar9);
          }
        }
        lVar11 = lVar11 + 1;
      } while (iVar4 != lVar11);
    }
    break;
  default:
    goto switchD_00124b94_caseD_3;
  case 4:
    lVar11 = *data1;
    if (lVar11 == 0) {
      builtin_strncpy(__string,"0.0",4);
    }
    else {
      bVar1 = *data2;
      iVar4 = sprintf(__string,"%ld ",lVar11);
      uVar12 = (uint)bVar1;
      if (iVar4 + -1 <= (int)(uint)bVar1) {
        iVar4 = sprintf(__string,"0%0*ld ",(ulong)uVar12,lVar11);
      }
      if (uVar12 != 0) {
        bVar3 = true;
        uVar7 = 0;
        pcVar9 = __string + iVar4;
        do {
          pcVar6 = pcVar9 + -1;
          if (bVar1 - 1 == uVar7 || !bVar3) {
            cVar10 = pcVar9[-2];
LAB_00124d43:
            *pcVar6 = cVar10;
            bVar3 = false;
          }
          else {
            cVar10 = pcVar9[-2];
            if (cVar10 != '0') goto LAB_00124d43;
            *pcVar6 = '\0';
            bVar3 = true;
          }
          uVar7 = uVar7 + 1;
          pcVar9 = pcVar6;
        } while (uVar12 != uVar7);
        iVar4 = iVar4 - uVar7;
      }
      __string[(long)iVar4 + -1] = '.';
    }
    break;
  case 7:
    pcVar9 = *value;
    pcVar6 = strchr(pcVar9,0x3a);
    if (pcVar6 == (char *)0x0) {
      sprintf(__string,"%s:%s",data1,pcVar9);
    }
    else {
      strcpy(__string,pcVar9);
    }
    break;
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x12:
    uVar8 = *data1;
    pcVar9 = "%ld";
    goto LAB_00124bb4;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    uVar8 = *data1;
    pcVar9 = "%lu";
LAB_00124bb4:
    sprintf(__string,pcVar9,uVar8);
  }
  pcVar9 = *value;
  iVar4 = strcmp(__string,pcVar9);
  if (iVar4 != 0) {
    lydict_remove(ctx,pcVar9);
    pcVar9 = lydict_insert(ctx,__string,0);
    *value = pcVar9;
  }
switchD_00124b94_caseD_3:
  if (__src != (char *)0x0) {
    strcpy(__string,__src);
    free(__src);
  }
  puVar5 = ly_buf_used_location();
  *puVar5 = *puVar5 + 0xff;
  return (int)puVar5;
}

Assistant:

static int
make_canonical(struct ly_ctx *ctx, int type, const char **value, void *data1, void *data2)
{
    char *buf = ly_buf(), *buf_backup = NULL, *str;
    struct lys_type_bit **bits = NULL;
    const char *module_name;
    int i, j, count, ret = 0;
    int64_t num;
    uint64_t unum;
    uint8_t c;

    /* prepare buffer for creating canonical representation */
    if (ly_buf_used && buf[0]) {
        buf_backup = strndup(buf, LY_BUF_SIZE - 1);
    }
    ly_buf_used++;

    switch (type) {
    case LY_TYPE_BITS:
        bits = (struct lys_type_bit **)data1;
        count = *((int *)data2);
        /* in canonical form, the bits are ordered by their position */
        buf[0] = '\0';
        for (i = 0; i < count; i++) {
            if (!bits[i]) {
                /* bit not set */
                continue;
            }
            if (buf[0]) {
                str = strdup(buf);
                sprintf(buf, "%s %s", str, bits[i]->name);
                free(str);
            } else {
                sprintf(buf, "%s", bits[i]->name);
            }
        }
        break;

    case LY_TYPE_IDENT:
        module_name = (const char *)data1;
        /* identity must always have a prefix */
        if (!strchr(*value, ':')) {
            sprintf(buf, "%s:%s", module_name, *value);
        } else {
            strcpy(buf, *value);
        }
        break;

    case LY_TYPE_DEC64:
        num = *((int64_t *)data1);
        c = *((uint8_t *)data2);
        if (num) {
            count = sprintf(buf, "%"PRId64" ", num);
            if ((count - 1) <= c) {
                /* we have 0. value, print the value with the leading zeros
                 * (one for 0. and also keep the correct with of num according
                 * to fraction-digits value) */
                count = sprintf(buf, "0%0*"PRId64" ", c, num);
            }
            for (i = c, j = 1; i > 0 ; i--) {
                if (j && i > 1 && buf[count - 2] == '0') {
                    /* we have trailing zero to skip */
                    buf[count - 1] = '\0';
                } else {
                    j = 0;
                    buf[count - 1] = buf[count - 2];
                }
                count--;
            }
            buf[count - 1] = '.';
        } else {
            /* zero */
            sprintf(buf, "0.0");
        }
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
        num = *((int64_t *)data1);
        sprintf(buf, "%"PRId64, num);
        break;

    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        unum = *((uint64_t *)data1);
        sprintf(buf, "%"PRIu64, unum);
        break;

    default:
        /* should not be even called - just do nothing */
        goto cleanup;
    }

    if (strcmp(buf, *value)) {
        lydict_remove(ctx, *value);
        *value = lydict_insert(ctx, buf, 0);
        ret = 1;
    }

cleanup:
    if (buf_backup) {
        /* return previous internal buffer content */
        strcpy(buf, buf_backup);
        free(buf_backup);
    }
    ly_buf_used--;

    return ret;
}